

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeRAW.cpp
# Opt level: O3

void __thiscall FormatTypeRAW::HandleHWInfo(FormatTypeRAW *this,char *info,int size)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = strstr(info,"sck=");
  if (pcVar1 != (char *)0x0) {
    pcVar2 = strchr(pcVar1,0x2c);
    if (pcVar2 == (char *)0x0) {
      __isoc99_sscanf(pcVar1,"sck=%Lf",&this->sck_);
    }
    else {
      *pcVar2 = '\0';
      __isoc99_sscanf(pcVar1,"sck=%Lf",&this->sck_);
      *pcVar2 = ',';
    }
  }
  pcVar1 = strstr(info,"ick=");
  if (pcVar1 != (char *)0x0) {
    pcVar2 = strchr(pcVar1,0x2c);
    if (pcVar2 != (char *)0x0) {
      *pcVar2 = '\0';
    }
    __isoc99_sscanf(pcVar1,"ick=%Lf",&this->ick_);
    return;
  }
  return;
}

Assistant:

void FormatTypeRAW::HandleHWInfo(char* info, int size)
{
   // scan for sck / ick
   char* buffer = strstr(info, "sck=");
   if (buffer != NULL)
   {
      // replace first ',' by a \0
      char* pch = strchr(buffer, ',');
      if (pch != NULL) pch[0] = '\0';


      sscanf(buffer, "sck=%Lf", &sck_);

      if (pch != NULL) pch[0] = ',';
   }
   buffer = strstr(info, "ick=");
   if (buffer != NULL)
   {
      // replace first ',' by a \0
      char* pch = strchr(buffer, ',');
      if (pch != NULL) pch[0] = '\0';
      sscanf(buffer, "ick=%Lf", &ick_);
   }
}